

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

void * parse_class_block(Parser *parser)

{
  Kind KVar1;
  List *stmts;
  void *data;
  BlockStmt *pBVar2;
  
  expect(parser,OP_FL_BRA);
  while (parser->token->kind == NEWLINE) {
    move(parser);
  }
  stmts = new_list();
  while ((KVar1 = parser->token->kind, KVar1 != CL_FL_BRA && (KVar1 != END))) {
    data = parse_stmt(parser);
    list_add(stmts,data);
    bmove(parser);
  }
  expect(parser,CL_FL_BRA);
  pBVar2 = new_block_stmt(stmts);
  return pBVar2;
}

Assistant:

void *parse_class_block(Parser *parser) {
    expect(parser, OP_FL_BRA);
    break_newline(parser);
    List *stmts = new_list();
    while (token(parser)->kind != CL_FL_BRA && token(parser)->kind != END) {
        list_add(stmts, parse_stmt(parser));
        bmove(parser);
    }
    expect(parser, CL_FL_BRA);
    return new_block_stmt(stmts);
}